

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parseVersions.h
# Opt level: O2

void __thiscall
glslang::TParseVersions::TParseVersions
          (TParseVersions *this,TIntermediate *interm,int version,EProfile profile,
          SpvVersion *spvVersion,EShLanguage language,TInfoSink *infoSink,bool forwardCompatible,
          EShMessages messages)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined3 uVar4;
  
  this->_vptr_TParseVersions = (_func_int **)&PTR__TParseVersions_00a5ba48;
  this->forwardCompatible = forwardCompatible;
  this->profile = profile;
  this->infoSink = infoSink;
  this->version = version;
  this->language = language;
  iVar1 = spvVersion->vulkanGlsl;
  iVar2 = spvVersion->vulkan;
  iVar3 = spvVersion->openGl;
  (this->spvVersion).spv = spvVersion->spv;
  (this->spvVersion).vulkanGlsl = iVar1;
  (this->spvVersion).vulkan = iVar2;
  (this->spvVersion).openGl = iVar3;
  uVar4 = *(undefined3 *)&spvVersion->field_0x11;
  (this->spvVersion).vulkanRelaxed = spvVersion->vulkanRelaxed;
  *(undefined3 *)&(this->spvVersion).field_0x11 = uVar4;
  this->intermediate = interm;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TExtensionBehavior>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TExtensionBehavior>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TExtensionBehavior>_>_>
  ::
  _Rb_tree_impl<std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_true>
  ::_Rb_tree_impl((_Rb_tree_impl<std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_true>
                   *)&this->extensionBehavior);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_unsigned_int>_>_>
  ::
  _Rb_tree_impl<std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_true>
  ::_Rb_tree_impl((_Rb_tree_impl<std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_true>
                   *)&this->extensionMinSpv);
  TVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>
  ::TVector(&this->spvUnsupportedExt);
  this->messages = messages;
  this->numErrors = 0;
  this->currentScanner = (TInputScanner *)0x0;
  return;
}

Assistant:

TParseVersions(TIntermediate& interm, int version, EProfile profile,
                   const SpvVersion& spvVersion, EShLanguage language, TInfoSink& infoSink,
                   bool forwardCompatible, EShMessages messages)
        :
        forwardCompatible(forwardCompatible),
        profile(profile),
        infoSink(infoSink), version(version), 
        language(language),
        spvVersion(spvVersion), 
        intermediate(interm), messages(messages), numErrors(0), currentScanner(nullptr) { }